

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

uint32_t mp_sizeof_strl(uint32_t len)

{
  uint32_t uVar1;
  
  if (len < 0x20) {
    uVar1 = 1;
  }
  else if (len < 0x100) {
    uVar1 = 2;
  }
  else {
    uVar1 = (uint)(0xffff < len) * 2 + 3;
  }
  return uVar1;
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_strl(uint32_t len)
{
	if (len <= 31) {
		return 1;
	} else if (len <= UINT8_MAX) {
		return 1 + sizeof(uint8_t);
	} else if (len <= UINT16_MAX) {
		return 1 + sizeof(uint16_t);
	} else {
		return 1 + sizeof(uint32_t);
	}
}